

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::CleanupSourceInfo(FunctionBody *this,bool isScriptContextClosing)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Utf8SourceInfo **ppUVar4;
  Utf8SourceInfo *this_00;
  bool isScriptContextClosing_local;
  FunctionBody *this_local;
  
  if ((*(uint *)&this->field_0x178 >> 9 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1ceb,"(this->cleanedUp)","this->cleanedUp");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((*(uint *)&this->field_0x178 >> 10 & 1) == 0) {
    bVar2 = GetIsFuncRegistered(this);
    if ((bVar2) && (!isScriptContextClosing)) {
      ppUVar4 = Memory::WriteBarrierPtr::operator_cast_to_Utf8SourceInfo__
                          ((WriteBarrierPtr *)
                           &(this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo
                          );
      if (*ppUVar4 == (Utf8SourceInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0x1cf3,"(this->m_utf8SourceInfo)","this->m_utf8SourceInfo");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      this_00 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)this);
      Utf8SourceInfo::RemoveFunctionBody(this_00,this);
    }
    if ((this->m_sourceInfo).pSpanSequence != (Type)0x0) {
      Memory::
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::SmallSpanSequence>
                (&Memory::HeapAllocator::Instance,(this->m_sourceInfo).pSpanSequence);
      (this->m_sourceInfo).pSpanSequence = (Type)0x0;
    }
    *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xfffffbff | 0x400;
  }
  return;
}

Assistant:

void FunctionBody::CleanupSourceInfo(bool isScriptContextClosing)
    {
        Assert(this->cleanedUp);

        if (!sourceInfoCleanedUp)
        {
            if (GetIsFuncRegistered() && !isScriptContextClosing)
            {
                // If our function is registered, then there must
                // be a Utf8SourceInfo pinned by it.
                Assert(this->m_utf8SourceInfo);

                this->GetUtf8SourceInfo()->RemoveFunctionBody(this);
            }

            if (this->m_sourceInfo.pSpanSequence != nullptr)
            {
                HeapDelete(this->m_sourceInfo.pSpanSequence);
                this->m_sourceInfo.pSpanSequence = nullptr;
            }

            sourceInfoCleanedUp = true;
        }
    }